

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderMaxUniformComponentsTest::prepareProgramInput
          (GeometryShaderMaxUniformComponentsTest *this)

{
  pointer piVar1;
  int iVar2;
  GLint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  long lVar6;
  TestError *this_00;
  long lVar5;
  
  iVar2 = (*((this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(lVar5 + 0xb48))
                    ((this->super_GeometryShaderLimitsTransformFeedbackBase).m_program_object_id,
                     "uni_array");
  this->m_uniform_location = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Failed to get uniform location",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x554);
  if (this->m_uniform_location != -1) {
    std::vector<int,_std::allocator<int>_>::resize
              (&this->m_uniform_data,(long)this->m_max_uniform_components);
    piVar1 = (this->m_uniform_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    while (lVar6 < this->m_max_uniform_components) {
      piVar1[lVar6] = (int)(lVar6 + 1);
      lVar6 = lVar6 + 1;
    }
    (**(code **)(lVar5 + 0x15b8))(this->m_uniform_location,this->m_max_uniform_vectors);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Failed to set uniform data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                    ,0x569);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid uniform location",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
             ,0x558);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GeometryShaderMaxUniformComponentsTest::prepareProgramInput()
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Uniform location */
	m_uniform_location = gl.getUniformLocation(m_program_object_id, "uni_array");

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to get uniform location");

	if (-1 == m_uniform_location)
	{
		TCU_FAIL("Invalid uniform location");
	}

	/* 3. Configure the uniforms to use subsequently increasing values, starting
	 *  from 1 for R component of first vector, 2 for G component of that vector,
	 *  5 for first component of second vector, and so on.
	 **/
	m_uniform_data.resize(m_max_uniform_components);

	for (glw::GLint i = 0; i < m_max_uniform_components; ++i)
	{
		m_uniform_data[i] = i + 1;
	}

	/* Set uniform data */
	gl.uniform4iv(m_uniform_location, m_max_uniform_vectors, &m_uniform_data[0]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set uniform data");
}